

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.c
# Opt level: O0

int set_property_query(ECX_KEY *ecxkey,char *propq)

{
  char *pcVar1;
  char *in_RSI;
  char *in_RDI;
  int in_stack_fffffffffffffffc;
  
  CRYPTO_free(*(void **)(in_RDI + 8));
  in_RDI[8] = '\0';
  in_RDI[9] = '\0';
  in_RDI[10] = '\0';
  in_RDI[0xb] = '\0';
  in_RDI[0xc] = '\0';
  in_RDI[0xd] = '\0';
  in_RDI[0xe] = '\0';
  in_RDI[0xf] = '\0';
  if (in_RSI != (char *)0x0) {
    pcVar1 = CRYPTO_strdup(in_RSI,"providers/implementations/keymgmt/ecx_kmgmt.c",0x17d);
    *(char **)(in_RDI + 8) = pcVar1;
    if (*(long *)(in_RDI + 8) == 0) {
      ERR_new();
      ERR_set_debug(propq,in_stack_fffffffffffffffc,in_RDI);
      ERR_set_error(0x39,0xc0100,(char *)0x0);
      return 0;
    }
  }
  return 1;
}

Assistant:

static int set_property_query(KDF_SCRYPT *ctx, const char *propq)
{
    OPENSSL_free(ctx->propq);
    ctx->propq = NULL;
    if (propq != NULL) {
        ctx->propq = OPENSSL_strdup(propq);
        if (ctx->propq == NULL) {
            ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
            return 0;
        }
    }
    return 1;
}